

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

void cp_declarator(CPState *cp,CPDecl *decl)

{
  uint uVar1;
  CPDeclIdx CVar2;
  int iVar3;
  CTSize CVar4;
  CTInfo info;
  bool bVar5;
  
  iVar3 = cp->depth;
  cp->depth = iVar3 + 1;
  if (0x13 < iVar3) {
    cp_err(cp,LJ_ERR_XLEVELS);
  }
  while( true ) {
    while (iVar3 = cp_opt(cp,0x2a), iVar3 != 0) {
      cp_decl_attributes(cp,decl);
      uVar1 = decl->attr;
      bVar5 = (uVar1 & 0xff00) != 0x400;
      decl->attr = uVar1 & 0xfcff00ff;
      cp_push(decl,(uint)bVar5 * 0x10000 + (uVar1 & 0x3800000) + 0x20020000,(uint)bVar5 * 4 + 4);
    }
    iVar3 = cp_opt(cp,0x26);
    if ((iVar3 == 0) && (iVar3 = cp_opt(cp,0x105), iVar3 == 0)) break;
    decl->attr = decl->attr & 0xfcff00ff;
    cp_push(decl,0x22830000,8);
  }
  iVar3 = cp_opt(cp,0x28);
  if (iVar3 == 0) {
    if (cp->tok == 0x100) {
      if ((decl->mode & 4) == 0) {
        cp_err_token(cp,0x103);
      }
      decl->name = cp->str;
      decl->nameid = (cp->val).id;
      cp_next(cp);
    }
    else if ((decl->mode & 2) == 0) {
      cp_err_token(cp,0x100);
    }
  }
  else {
    cp_decl_attributes(cp,decl);
    if ((decl->mode & 2) != 0) {
      if (cp->tok == 0x29) goto LAB_001370f2;
      iVar3 = cp_istypedecl(cp);
      if (iVar3 != 0) goto LAB_001370f2;
    }
    CVar2 = decl->pos;
    cp_declarator(cp,decl);
    cp_check(cp,0x29);
    decl->pos = CVar2;
  }
  while( true ) {
    while (iVar3 = cp_opt(cp,0x5b), iVar3 != 0) {
      cp_decl_attributes(cp,decl);
      iVar3 = cp_opt(cp,0x3f);
      CVar4 = 0xffffffff;
      info = 0x30100000;
      if ((iVar3 == 0) && (info = 0x30000000, cp->tok != 0x5d)) {
        CVar4 = cp_expr_ksize(cp);
      }
      cp_check(cp,0x5d);
      cp_add(decl,info,CVar4);
    }
    iVar3 = cp_opt(cp,0x28);
    if (iVar3 == 0) break;
LAB_001370f2:
    cp_decl_func(cp,decl);
  }
  if (((decl->mode & 8) != 0) && (iVar3 = cp_opt(cp,0x3a), iVar3 != 0)) {
    CVar4 = cp_expr_ksize(cp);
    decl->bits = CVar4;
  }
  cp_decl_attributes(cp,decl);
  if ((((decl->stack[decl->pos].info & 0xf0000000) != 0x60000000) && ((decl->attr & 1) != 0)) &&
     ((decl->mode & 8) == 0)) {
    cp_push(decl,0x80020000,decl->attr >> 0x10 & 0xf);
  }
  cp->depth = cp->depth + -1;
  return;
}

Assistant:

static void cp_declarator(CPState *cp, CPDecl *decl)
{
  if (++cp->depth > CPARSE_MAX_DECLDEPTH) cp_err(cp, LJ_ERR_XLEVELS);

  for (;;) {  /* Head of declarator. */
    if (cp_opt(cp, '*')) {  /* Pointer. */
      CTSize sz;
      CTInfo info;
      cp_decl_attributes(cp, decl);
      sz = CTSIZE_PTR;
      info = CTINFO(CT_PTR, CTALIGN_PTR);
#if LJ_64
      if (ctype_msizeP(decl->attr) == 4) {
	sz = 4;
	info = CTINFO(CT_PTR, CTALIGN(2));
      }
#endif
      info += (decl->attr & (CTF_QUAL|CTF_REF));
      decl->attr &= ~(CTF_QUAL|(CTMASK_MSIZEP<<CTSHIFT_MSIZEP));
      cp_push(decl, info, sz);
    } else if (cp_opt(cp, '&') || cp_opt(cp, CTOK_ANDAND)) {  /* Reference. */
      decl->attr &= ~(CTF_QUAL|(CTMASK_MSIZEP<<CTSHIFT_MSIZEP));
      cp_push(decl, CTINFO_REF(0), CTSIZE_PTR);
    } else {
      break;
    }
  }

  if (cp_opt(cp, '(')) {  /* Inner declarator. */
    CPDeclIdx pos;
    cp_decl_attributes(cp, decl);
    /* Resolve ambiguity between inner declarator and 1st function parameter. */
    if ((decl->mode & CPARSE_MODE_ABSTRACT) &&
	(cp->tok == ')' || cp_istypedecl(cp))) goto func_decl;
    pos = decl->pos;
    cp_declarator(cp, decl);
    cp_check(cp, ')');
    decl->pos = pos;
  } else if (cp->tok == CTOK_IDENT) {  /* Direct declarator. */
    if (!(decl->mode & CPARSE_MODE_DIRECT)) cp_err_token(cp, CTOK_EOF);
    decl->name = cp->str;
    decl->nameid = cp->val.id;
    cp_next(cp);
  } else {  /* Abstract declarator. */
    if (!(decl->mode & CPARSE_MODE_ABSTRACT)) cp_err_token(cp, CTOK_IDENT);
  }

  for (;;) {  /* Tail of declarator. */
    if (cp_opt(cp, '[')) {  /* Array. */
      cp_decl_array(cp, decl);
    } else if (cp_opt(cp, '(')) {  /* Function. */
    func_decl:
      cp_decl_func(cp, decl);
    } else {
      break;
    }
  }

  if ((decl->mode & CPARSE_MODE_FIELD) && cp_opt(cp, ':'))  /* Field width. */
    decl->bits = cp_expr_ksize(cp);

  /* Process postfix attributes. */
  cp_decl_attributes(cp, decl);
  cp_push_attributes(decl);

  cp->depth--;
}